

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserBoxShadow.cpp
# Opt level: O0

bool __thiscall
Rml::PropertyParserBoxShadow::ParseValue
          (PropertyParserBoxShadow *this,Property *property,String *value,ParameterMap *param_3)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  size_type __n;
  reference pvVar4;
  Variant local_238;
  Colour<unsigned_char,_255,_false> local_210;
  Colour<unsigned_char,_255,_true> local_20c;
  NumericValue local_208;
  NumericValue local_200;
  NumericValue local_1f8;
  NumericValue local_1f0;
  undefined1 local_1e8 [8];
  Property prop;
  String *argument;
  iterator __end2;
  iterator __begin2;
  StringList *__range2;
  int length_argument_index;
  BoxShadow *shadow;
  NumericValue local_15c;
  NumericValue local_154;
  NumericValue local_14c;
  bool local_144;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140 [8];
  StringList arguments;
  String *shadow_str;
  iterator __end1;
  iterator __begin1;
  StringList *__range1;
  BoxShadowList shadow_list;
  ParameterMap empty_parameter_map;
  String local_b0;
  undefined1 local_90 [8];
  String lowercase_value;
  StringList shadows_string_list;
  ParameterMap *param_3_local;
  String *value_local;
  Property *property_local;
  PropertyParserBoxShadow *this_local;
  
  uVar3 = ::std::__cxx11::string::empty();
  if (((uVar3 & 1) != 0) || (bVar1 = ::std::operator==(value,"none"), bVar1)) {
    Variant::Variant((Variant *)
                     &shadows_string_list.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Variant::operator=(&property->value,
                       (Variant *)
                       &shadows_string_list.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Variant::~Variant((Variant *)
                      &shadows_string_list.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    property->unit = UNKNOWN;
    this_local._7_1_ = 1;
  }
  else {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(lowercase_value.field_2._M_local_buf + 8));
    ::std::__cxx11::string::string((string *)&local_b0,(string *)value);
    StringUtilities::ToLower((String *)local_90,&local_b0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    StringUtilities::ExpandString
              ((StringList *)((long)&lowercase_value.field_2 + 8),(String *)local_90,',','(',')',
               false);
    ::std::__cxx11::string::~string((string *)local_90);
    bVar1 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(lowercase_value.field_2._M_local_buf + 8));
    if (bVar1) {
      this_local._7_1_ = 0;
    }
    else {
      robin_hood::detail::
      Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::Table((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&shadow_list.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::vector
                ((vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)&__range1);
      __n = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(lowercase_value.field_2._M_local_buf + 8));
      ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::reserve
                ((vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)&__range1,__n);
      __end1 = ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(lowercase_value.field_2._M_local_buf + 8));
      shadow_str = (String *)
                   ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(lowercase_value.field_2._M_local_buf + 8));
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&shadow_str), bVar1) {
        arguments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(local_140);
        StringUtilities::ExpandString
                  ((StringList *)local_140,
                   arguments.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,' ','(',')',false);
        bVar1 = ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(local_140);
        if (bVar1) {
          this_local._7_1_ = 0;
          bVar1 = true;
        }
        else {
          Colour<unsigned_char,_255,_true>::Colour
                    ((Colour<unsigned_char,_255,_true> *)&shadow,'\0',0xff);
          NumericValue::NumericValue((NumericValue *)((long)&shadow + 4));
          NumericValue::NumericValue(&local_15c);
          NumericValue::NumericValue(&local_154);
          NumericValue::NumericValue(&local_14c);
          local_144 = false;
          ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::push_back
                    ((vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)&__range1,
                     (value_type *)&shadow);
          pvVar4 = ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::back
                             ((vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)&__range1);
          __range2._4_4_ = 0;
          __end2 = ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(local_140);
          argument = (String *)
                     ::std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(local_140);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&argument), bVar1) {
            prop.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
            uVar3 = ::std::__cxx11::string::empty();
            if ((uVar3 & 1) == 0) {
              Property::Property((Property *)local_1e8);
              uVar2 = (*this->parser_length->_vptr_PropertyParser[2])
                                (this->parser_length,local_1e8,
                                 prop.source.
                                 super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi,
                                 &shadow_list.
                                  super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if ((uVar2 & 1) == 0) {
                bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)prop.source.
                                             super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi,"inset");
                if (bVar1) {
                  pvVar4->inset = true;
                }
                else {
                  uVar2 = (*this->parser_color->_vptr_PropertyParser[2])
                                    (this->parser_color,local_1e8,
                                     prop.source.
                                     super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi,
                                     &shadow_list.
                                      super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if ((uVar2 & 1) == 0) {
                    this_local._7_1_ = 0;
                    bVar1 = true;
                    goto LAB_005e5da2;
                  }
                  local_210 = Property::Get<Rml::Colour<unsigned_char,255,false>>
                                        ((Property *)local_1e8);
                  local_20c = Colour<unsigned_char,255,false>::
                              ToPremultiplied<std::integral_constant<bool,false>,void>
                                        ((Colour<unsigned_char,255,false> *)&local_210);
                  (pvVar4->color).red = local_20c.red;
                  (pvVar4->color).green = local_20c.green;
                  (pvVar4->color).blue = local_20c.blue;
                  (pvVar4->color).alpha = local_20c.alpha;
                }
              }
              else {
                switch(__range2._4_4_) {
                case 0:
                  local_1f0 = Property::GetNumericValue((Property *)local_1e8);
                  pvVar4->offset_x = local_1f0;
                  break;
                case 1:
                  local_1f8 = Property::GetNumericValue((Property *)local_1e8);
                  pvVar4->offset_y = local_1f8;
                  break;
                case 2:
                  local_200 = Property::GetNumericValue((Property *)local_1e8);
                  pvVar4->blur_radius = local_200;
                  break;
                case 3:
                  local_208 = Property::GetNumericValue((Property *)local_1e8);
                  pvVar4->spread_distance = local_208;
                  break;
                default:
                  this_local._7_1_ = 0;
                  bVar1 = true;
                  goto LAB_005e5da2;
                }
                __range2._4_4_ = __range2._4_4_ + 1;
              }
              bVar1 = false;
LAB_005e5da2:
              Property::~Property((Property *)local_1e8);
              if (bVar1) goto LAB_005e5df0;
            }
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end2);
          }
          if (__range2._4_4_ < 2) {
            this_local._7_1_ = 0;
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
        }
LAB_005e5df0:
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_140);
        if (bVar1) goto LAB_005e5e73;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      property->unit = BOXSHADOWLIST;
      Variant::Variant<std::vector<Rml::BoxShadow,std::allocator<Rml::BoxShadow>>,void>
                (&local_238,(vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)&__range1);
      Variant::operator=(&property->value,&local_238);
      Variant::~Variant(&local_238);
      this_local._7_1_ = 1;
LAB_005e5e73:
      ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::~vector
                ((vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)&__range1);
      robin_hood::detail::
      Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~Table((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&shadow_list.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(lowercase_value.field_2._M_local_buf + 8));
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool PropertyParserBoxShadow::ParseValue(Property& property, const String& value, const ParameterMap& /*parameters*/) const
{
	if (value.empty() || value == "none")
	{
		property.value = Variant();
		property.unit = Unit::UNKNOWN;
		return true;
	}

	StringList shadows_string_list;
	{
		auto lowercase_value = StringUtilities::ToLower(value);
		StringUtilities::ExpandString(shadows_string_list, lowercase_value, ',', '(', ')');
	}

	if (shadows_string_list.empty())
		return false;

	const ParameterMap empty_parameter_map;

	BoxShadowList shadow_list;
	shadow_list.reserve(shadows_string_list.size());

	for (const String& shadow_str : shadows_string_list)
	{
		StringList arguments;
		StringUtilities::ExpandString(arguments, shadow_str, ' ', '(', ')');
		if (arguments.empty())
			return false;

		shadow_list.push_back({});
		BoxShadow& shadow = shadow_list.back();

		int length_argument_index = 0;

		for (const String& argument : arguments)
		{
			if (argument.empty())
				continue;

			Property prop;
			if (parser_length->ParseValue(prop, argument, empty_parameter_map))
			{
				switch (length_argument_index)
				{
				case 0: shadow.offset_x = prop.GetNumericValue(); break;
				case 1: shadow.offset_y = prop.GetNumericValue(); break;
				case 2: shadow.blur_radius = prop.GetNumericValue(); break;
				case 3: shadow.spread_distance = prop.GetNumericValue(); break;
				default: return false;
				}
				length_argument_index += 1;
			}
			else if (argument == "inset")
			{
				shadow.inset = true;
			}
			else if (parser_color->ParseValue(prop, argument, empty_parameter_map))
			{
				shadow.color = prop.Get<Colourb>().ToPremultiplied();
			}
			else
			{
				return false;
			}
		}

		if (length_argument_index < 2)
			return false;
	}

	property.unit = Unit::BOXSHADOWLIST;
	property.value = Variant(std::move(shadow_list));

	return true;
}